

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

NetType cfd::capi::ConvertNetType(int network_type,bool *is_bitcoin)

{
  bool bVar1;
  CfdException *this;
  int local_44;
  undefined1 local_40 [32];
  
  if ((uint)network_type < 3) {
    bVar1 = true;
    if (is_bitcoin == (bool *)0x0) {
      return network_type;
    }
  }
  else {
    if (2 < network_type - 10U) {
      local_40._0_8_ = "cfdcapi_common.cpp";
      local_40._8_4_ = 0x84;
      local_40._16_8_ = "ConvertNetType";
      local_44 = network_type;
      core::logger::log<int&>
                ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"Illegal network type.({})",
                 &local_44);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._0_8_ = local_40 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Illegal network type.","")
      ;
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    network_type = network_type - (kElementsRegtest|kLiquidV1);
    if (is_bitcoin == (bool *)0x0) {
      return network_type;
    }
    bVar1 = false;
  }
  *is_bitcoin = bVar1;
  return network_type;
}

Assistant:

NetType ConvertNetType(int network_type, bool* is_bitcoin) {
  NetType net_type = NetType::kCustomChain;
  switch (network_type) {
    case kCfdNetworkMainnet:
    case kCfdNetworkTestnet:
    case kCfdNetworkRegtest:
      net_type = static_cast<NetType>(network_type);
      if (is_bitcoin != nullptr) {
        *is_bitcoin = true;
      }
      break;
    default:
#ifndef CFD_DISABLE_ELEMENTS
      if (network_type == kCfdNetworkLiquidv1) {
        net_type = NetType::kLiquidV1;
      } else if (network_type == kCfdNetworkElementsRegtest) {
        net_type = NetType::kElementsRegtest;
      } else if (network_type == kCfdNetworkCustomChain) {
        // do nothing
      } else {
        warn(CFD_LOG_SOURCE, "Illegal network type.({})", network_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Illegal network type.");
      }
      if (is_bitcoin != nullptr) {
        *is_bitcoin = false;
      }
      break;
#else
      warn(CFD_LOG_SOURCE, "Illegal network type.({})", network_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal network type.");
#endif  // CFD_DISABLE_ELEMENTS
  }
  return net_type;
}